

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_wait(Curl_multi *multi,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar6;
  CURLMcode CVar7;
  int iVar8;
  ushort uVar9;
  Curl_easy *data;
  Curl_easy *data_00;
  pollfd *ufds;
  int iVar10;
  undefined1 auVar11 [16];
  curl_socket_t sockbunch [5];
  long timeout_internal;
  
  CVar7 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    multi_timeout(multi,&timeout_internal);
    data = (Curl_easy *)&multi->easyp;
    iVar10 = 0;
    uVar5 = extraout_RDX;
    data_00 = data;
LAB_0012a436:
    data_00 = data_00->next;
    if (data_00 != (Curl_easy *)0x0) {
      uVar1 = multi_getsock(data_00,sockbunch,(int)uVar5);
      lVar4 = 0;
      uVar5 = extraout_RDX_00;
      do {
        if (lVar4 == 5) break;
        if ((uVar1 >> ((uint)lVar4 & 0x1f) & 1) == 0) {
          uVar5 = 0xffffffff;
        }
        else {
          iVar10 = iVar10 + 1;
          uVar5 = (ulong)(uint)sockbunch[lVar4];
        }
        if (((uVar1 >> ((byte)lVar4 & 0x1f)) >> 0x10 & 1) != 0) {
          iVar10 = iVar10 + 1;
          uVar5 = (ulong)(uint)sockbunch[lVar4];
        }
        lVar4 = lVar4 + 1;
      } while ((int)uVar5 != -1);
      goto LAB_0012a436;
    }
    lVar4 = (long)timeout_ms;
    if (timeout_internal < timeout_ms) {
      lVar4 = timeout_internal;
    }
    iVar3 = (int)lVar4;
    if (timeout_internal < 0) {
      iVar3 = timeout_ms;
    }
    uVar1 = 0;
    if (iVar10 + extra_nfds == 0 && extra_nfds == 0) {
      auVar11 = ZEXT416(extra_nfds) << 0x40;
    }
    else {
      auVar11 = (undefined1  [16])(*Curl_cmalloc)((ulong)(iVar10 + extra_nfds) << 3);
      if (auVar11._0_8_ == 0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    uVar5 = auVar11._8_8_;
    ufds = auVar11._0_8_;
    if (iVar10 != 0) {
      uVar1 = 0;
LAB_0012a4d4:
      data = data->next;
      if (data != (Curl_easy *)0x0) {
        uVar2 = multi_getsock(data,sockbunch,(int)uVar5);
        lVar4 = 0;
        uVar5 = extraout_RDX_01;
        do {
          if (lVar4 == 5) break;
          if ((uVar2 >> ((uint)lVar4 & 0x1f) & 1) == 0) {
            uVar5 = 0xffffffff;
          }
          else {
            uVar5 = (ulong)(uint)sockbunch[lVar4];
            ufds[uVar1].fd = sockbunch[lVar4];
            ufds[uVar1].events = 1;
            uVar1 = uVar1 + 1;
          }
          if (((uVar2 >> ((byte)lVar4 & 0x1f)) >> 0x10 & 1) != 0) {
            uVar5 = (ulong)(uint)sockbunch[lVar4];
            ufds[uVar1].fd = sockbunch[lVar4];
            ufds[uVar1].events = 4;
            uVar1 = uVar1 + 1;
          }
          lVar4 = lVar4 + 1;
        } while ((int)uVar5 != -1);
        goto LAB_0012a4d4;
      }
    }
    uVar5 = 0;
    while( true ) {
      uVar2 = (uint)(uVar1 + uVar5);
      if (extra_nfds == uVar5) break;
      uVar6 = uVar1 + uVar5 & 0xffffffff;
      ufds[uVar6].fd = extra_fds[uVar5].fd;
      uVar9 = extra_fds[uVar5].events & 1;
      ufds[uVar6].events = uVar9;
      if ((extra_fds[uVar5].events & 6U) != 0) {
        ufds[uVar6].events = uVar9 | extra_fds[uVar5].events & 6U;
      }
      uVar5 = uVar5 + 1;
    }
    CVar7 = CURLM_OK;
    iVar8 = 0;
    if (uVar2 != 0) {
      iVar3 = Curl_poll(ufds,uVar2,iVar3);
      iVar8 = 0;
      if (0 < iVar3) {
        for (uVar5 = 0; iVar8 = iVar3, extra_nfds != uVar5; uVar5 = uVar5 + 1) {
          extra_fds[uVar5].revents = ufds[(uint)(iVar10 + (int)uVar5)].revents & 7;
        }
      }
    }
    (*Curl_cfree)(ufds);
    if (ret != (int *)0x0) {
      *ret = iVar8;
    }
  }
  return CVar7;
}

Assistant:

CURLMcode curl_multi_wait(struct Curl_multi *multi,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_easy *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  long timeout_internal;
  int retcode = 0;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds || extra_nfds) {
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data=multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    int pollrc;
    /* wait... */
    pollrc = Curl_poll(ufds, nfds, timeout_ms);
    DEBUGF(infof(data, "Curl_poll(%d ds, %d ms) == %d\n",
                 nfds, timeout_ms, pollrc));

    if(pollrc > 0) {
      retcode = pollrc;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(i = 0; i < extra_nfds; i++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + i].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[i].revents = mask;
      }
    }
  }

  free(ufds);
  if(ret)
    *ret = retcode;
  return CURLM_OK;
}